

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::Subscription::Subscription(Subscription *this,Subscription *to_move)

{
  Subscription *to_move_local;
  Subscription *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::map(&this->price_fields_);
  price::subject::Subject::Subject(&this->subject_);
  this->status_ = to_move->status_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator=(&this->price_fields_,&to_move->price_fields_);
  price::subject::Subject::operator=(&this->subject_,&to_move->subject_);
  return;
}

Assistant:

Subscription::Subscription(bidfx_public_api::price::Subscription&& to_move)
{
    status_ = std::move(to_move.status_);
    price_fields_ = std::move(to_move.price_fields_);
    subject_ = std::move(to_move.subject_);
}